

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

SquareMatrix<4> * pbrt::Transpose<4>(SquareMatrix<4> *m)

{
  float *pfVar1;
  SquareMatrix<4> *in_RDI;
  int j;
  int i;
  float in_stack_ffffffffffffffbc;
  SquareMatrix<4> *this;
  span<float> local_30;
  span<const_float> local_20;
  int local_10;
  int local_c;
  
  this = in_RDI;
  SquareMatrix<4>::SquareMatrix(in_RDI);
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
      local_20 = SquareMatrix<4>::operator[](this,(int)in_stack_ffffffffffffffbc);
      pfVar1 = pstd::span<const_float>::operator[](&local_20,(long)local_c);
      in_stack_ffffffffffffffbc = *pfVar1;
      local_30 = SquareMatrix<4>::operator[](this,(int)in_stack_ffffffffffffffbc);
      pfVar1 = pstd::span<float>::operator[](&local_30,(long)local_10);
      *pfVar1 = in_stack_ffffffffffffffbc;
    }
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N> Transpose(const SquareMatrix<N> &m) {
    SquareMatrix<N> r;
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            r[i][j] = m[j][i];
    return r;
}